

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O3

void GC::FullGC(void)

{
  if (State < 2) {
    SweepPos = &Root;
    Gray = 0;
    State = 2;
  }
  else if (State == 3) goto LAB_00378a9c;
  do {
    SingleStep();
  } while (State != 3);
LAB_00378a9c:
  MarkRoot();
  while (State != 0) {
    SingleStep();
  }
  Threshold = (long)Pause * (Estimate / 100);
  return;
}

Assistant:

void FullGC()
{
	if (State <= GCS_Propagate)
	{
		// Reset sweep mark to sweep all elements (returning them to white)
		SweepPos = &Root;
		// Reset other collector lists
		Gray = NULL;
		State = GCS_Sweep;
	}
	// Finish any pending sweep phase
	while (State != GCS_Finalize)
	{
		SingleStep();
	}
	MarkRoot();
	while (State != GCS_Pause)
	{
		SingleStep();
	}
	SetThreshold();
}